

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

ScalarFunction *
duckdb::AddFunction::GetFunction
          (ScalarFunction *__return_storage_ptr__,LogicalType *left_type,LogicalType *right_type)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  LogicalType varargs_04;
  LogicalType varargs_05;
  LogicalType varargs_06;
  LogicalType varargs_07;
  LogicalType varargs_08;
  LogicalType varargs_09;
  LogicalType varargs_10;
  LogicalType varargs_11;
  LogicalType varargs_12;
  LogicalType varargs_13;
  LogicalType varargs_14;
  LogicalType varargs_15;
  LogicalType varargs_16;
  bool bVar3;
  NotImplementedException *pNVar4;
  PhysicalType type;
  BaseScalarFunction *this;
  long lVar5;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  initializer_list<duckdb::LogicalType> __l_05;
  initializer_list<duckdb::LogicalType> __l_06;
  initializer_list<duckdb::LogicalType> __l_07;
  initializer_list<duckdb::LogicalType> __l_08;
  initializer_list<duckdb::LogicalType> __l_09;
  initializer_list<duckdb::LogicalType> __l_10;
  initializer_list<duckdb::LogicalType> __l_11;
  initializer_list<duckdb::LogicalType> __l_12;
  initializer_list<duckdb::LogicalType> __l_13;
  initializer_list<duckdb::LogicalType> __l_14;
  initializer_list<duckdb::LogicalType> __l_15;
  initializer_list<duckdb::LogicalType> __l_16;
  undefined4 in_stack_ffffffffffffe91c;
  undefined4 in_stack_ffffffffffffe924;
  string in_stack_ffffffffffffe930;
  element_type *in_stack_ffffffffffffe938;
  LogicalType local_16b8;
  allocator_type local_169b;
  allocator local_169a;
  allocator local_1699;
  string local_1698;
  string local_1678;
  _Any_data local_1658;
  undefined8 local_1648;
  undefined8 uStack_1640;
  code *local_1638 [2];
  code *local_1628;
  code *local_1620;
  code *local_1618 [2];
  code *local_1608;
  code *local_1600;
  code *local_15f8 [2];
  code *local_15e8;
  code *local_15e0;
  code *local_15d8 [2];
  code *local_15c8;
  code *local_15c0;
  code *local_15b8 [2];
  code *local_15a8;
  code *local_15a0;
  code *local_1598 [2];
  code *local_1588;
  code *local_1580;
  code *local_1578 [2];
  code *local_1568;
  code *local_1560;
  code *local_1558 [2];
  code *local_1548;
  code *local_1540;
  code *local_1538 [2];
  code *local_1528;
  code *local_1520;
  code *local_1518 [2];
  code *local_1508;
  code *local_1500;
  code *local_14f8 [2];
  code *local_14e8;
  code *local_14e0;
  code *local_14d8 [2];
  code *local_14c8;
  code *local_14c0;
  code *local_14b8 [2];
  code *local_14a8;
  code *local_14a0;
  code *local_1498 [2];
  code *local_1488;
  code *local_1480;
  code *local_1478 [2];
  code *local_1468;
  code *local_1460;
  LogicalType local_1458;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1440;
  LogicalType local_1428;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1410;
  LogicalType local_13f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_13e0;
  LogicalType local_13c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_13b0;
  LogicalType local_1398;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1380;
  LogicalType local_1368;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1350;
  LogicalType local_1338;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1320;
  LogicalType local_1308;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_12f0;
  LogicalType local_12d8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_12c0;
  LogicalType local_12a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1290;
  LogicalType local_1278;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1260;
  LogicalType local_1248;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1230;
  LogicalType local_1218;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1200;
  LogicalType local_11e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_11d0;
  LogicalType local_11b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_11a0;
  LogicalType local_1188;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1170;
  LogicalType local_1158;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1140;
  LogicalType local_1128;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1110;
  _Any_data local_10f8;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  LogicalType local_10d0;
  string local_10b8;
  LogicalType local_1098;
  string local_1080;
  LogicalType local_1060;
  string local_1048;
  LogicalType local_1028;
  string local_1010;
  LogicalType local_ff0;
  string local_fd8;
  LogicalType local_fb8;
  string local_fa0;
  LogicalType local_f80;
  string local_f68;
  LogicalType local_f48;
  string local_f30;
  LogicalType local_f10;
  string local_ef8;
  LogicalType local_ed8;
  string local_ec0;
  LogicalType local_ea0;
  string local_e88;
  LogicalType local_e68;
  string local_e50;
  LogicalType local_e30;
  string local_e18;
  LogicalType local_df8;
  string local_de0;
  LogicalType local_dc0;
  string local_da8;
  LogicalType local_d88;
  scalar_function_t local_d70;
  string local_d50;
  LogicalType local_d30;
  string local_d18;
  LogicalType local_cf8;
  string local_ce0;
  string local_cc0;
  string local_ca0;
  BaseScalarFunction local_c80;
  BaseScalarFunction local_bd0;
  BaseScalarFunction local_b20;
  BaseScalarFunction local_a70;
  BaseScalarFunction local_9c0;
  BaseScalarFunction local_910;
  BaseScalarFunction local_860;
  BaseScalarFunction local_7b0;
  BaseScalarFunction local_700;
  BaseScalarFunction local_650;
  BaseScalarFunction local_5a0;
  BaseScalarFunction local_4f0;
  BaseScalarFunction local_440;
  BaseScalarFunction local_390;
  BaseScalarFunction local_2e0;
  BaseScalarFunction local_230;
  BaseScalarFunction local_180;
  BaseScalarFunction local_d0;
  
  bVar3 = LogicalType::IsNumeric(left_type);
  LVar1 = left_type->id_;
  if ((bVar3) && (LVar1 == right_type->id_)) {
    if (LVar1 == DECIMAL) {
      ::std::__cxx11::string::string((string *)&local_ce0,"+",(allocator *)&local_1698);
      LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
      LogicalType::LogicalType(&local_16b8,right_type);
      __l._M_len = 2;
      __l._M_array = (iterator)&stack0xffffffffffffe930;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_1110,__l,(allocator_type *)&local_1678);
      LogicalType::LogicalType(&local_1128,left_type);
      local_10e8 = 0;
      uStack_10e0 = 0;
      local_10f8._M_unused._M_object = (void *)0x0;
      local_10f8._8_8_ = 0;
      LogicalType::LogicalType(&local_cf8,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_cf8;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_ffffffffffffe91c;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_ffffffffffffe924;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_ce0,(vector<duckdb::LogicalType,_true> *)&local_1110,
                 &local_1128,(scalar_function_t *)&local_10f8,
                 BindDecimalAddSubtract<duckdb::AddOperator,duckdb::DecimalAddOverflowCheck,false>,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,
                 (FunctionNullHandling)in_stack_ffffffffffffe930,
                 (bind_lambda_function_t)in_stack_ffffffffffffe938);
      LogicalType::~LogicalType(&local_cf8);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_10f8);
      LogicalType::~LogicalType(&local_1128);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1110)
      ;
      lVar5 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      ::std::__cxx11::string::~string((string *)&local_ce0);
      BaseScalarFunction::SetReturnsError
                (&local_d0,&__return_storage_ptr__->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_d0);
      __return_storage_ptr__->serialize = SerializeDecimalArithmetic;
      __return_storage_ptr__->deserialize =
           DeserializeDecimalArithmetic<duckdb::AddOperator,duckdb::DecimalAddOverflowCheck,false>;
      return __return_storage_ptr__;
    }
    bVar3 = LogicalType::IsIntegral(left_type);
    if (bVar3) {
      ::std::__cxx11::string::string((string *)&local_d18,"+",&local_169a);
      LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
      LogicalType::LogicalType(&local_16b8,right_type);
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)&stack0xffffffffffffe930;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_1140,__l_01,&local_169b);
      LogicalType::LogicalType(&local_1158,left_type);
      PVar2 = left_type->physical_type_;
      local_1658._M_unused._M_object = (void *)0x0;
      local_1658._8_8_ = 0;
      local_1648 = 0;
      uStack_1640 = 0;
      switch(PVar2) {
      case UINT8:
        local_1698._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::AddOperatorOverflowCheck>
        ;
        break;
      case INT8:
        local_1698._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<signed_char,signed_char,signed_char,duckdb::AddOperatorOverflowCheck>
        ;
        break;
      case UINT16:
        local_1698._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::AddOperatorOverflowCheck>
        ;
        break;
      case INT16:
        local_1698._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<short,short,short,duckdb::AddOperatorOverflowCheck>;
        break;
      case UINT32:
        local_1698._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::AddOperatorOverflowCheck>
        ;
        break;
      case INT32:
        local_1698._M_dataplus._M_p =
             (pointer)ScalarFunction::BinaryFunction<int,int,int,duckdb::AddOperatorOverflowCheck>;
        break;
      case UINT64:
        local_1698._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::AddOperatorOverflowCheck>
        ;
        break;
      case INT64:
        local_1698._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<long,long,long,duckdb::AddOperatorOverflowCheck>;
        break;
      default:
        if (PVar2 == UINT128) {
          local_1698._M_dataplus._M_p =
               (pointer)ScalarFunction::
                        BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::AddOperatorOverflowCheck>
          ;
        }
        else {
          if (PVar2 != INT128) {
            pNVar4 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_1698,"Unimplemented type for GetScalarBinaryFunction: %s",
                       &local_1699);
            TypeIdToString_abi_cxx11_(&local_1678,(duckdb *)(ulong)PVar2,type);
            NotImplementedException::NotImplementedException<std::__cxx11::string>
                      (pNVar4,&local_1698,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1678);
            __cxa_throw(pNVar4,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          local_1698._M_dataplus._M_p =
               (pointer)ScalarFunction::
                        BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::AddOperatorOverflowCheck>
          ;
        }
      }
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 local_1658._M_pod_data,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)&local_1698);
      LogicalType::LogicalType(&local_d30,INVALID);
      varargs_16.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_16._0_8_ = &local_d30;
      varargs_16.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_ffffffffffffe91c;
      varargs_16.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_16.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_ffffffffffffe924;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_d18,(vector<duckdb::LogicalType,_true> *)&local_1140,
                 &local_1158,(scalar_function_t *)&local_1658,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,
                 PropagateNumericStats<duckdb::TryAddOperator,duckdb::AddPropagateStatistics,duckdb::AddOperator>
                 ,(init_local_state_t)0x0,varargs_16,CONSISTENT,
                 (FunctionNullHandling)in_stack_ffffffffffffe930,
                 (bind_lambda_function_t)in_stack_ffffffffffffe938);
      LogicalType::~LogicalType(&local_d30);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_1658);
      LogicalType::~LogicalType(&local_1158);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1140)
      ;
      lVar5 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      ::std::__cxx11::string::~string((string *)&local_d18);
      BaseScalarFunction::SetReturnsError
                (&local_180,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_180;
    }
    else {
      ::std::__cxx11::string::string((string *)&local_d50,"+",(allocator *)&local_1698);
      LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
      LogicalType::LogicalType(&local_16b8,right_type);
      __l_03._M_len = 2;
      __l_03._M_array = (iterator)&stack0xffffffffffffe930;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_1170,__l_03,(allocator_type *)&local_1678);
      LogicalType::LogicalType(&local_1188,left_type);
      GetScalarBinaryFunction<duckdb::AddOperator>(&local_d70,left_type->physical_type_);
      LogicalType::LogicalType(&local_d88,INVALID);
      varargs_02.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_02._0_8_ = &local_d88;
      varargs_02.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_ffffffffffffe91c;
      varargs_02.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_02.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_ffffffffffffe924;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_d50,(vector<duckdb::LogicalType,_true> *)&local_1170,
                 &local_1188,&local_d70,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs_02,CONSISTENT,
                 (FunctionNullHandling)in_stack_ffffffffffffe930,
                 (bind_lambda_function_t)in_stack_ffffffffffffe938);
      LogicalType::~LogicalType(&local_d88);
      ::std::_Function_base::~_Function_base(&local_d70.super__Function_base);
      LogicalType::~LogicalType(&local_1188);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1170)
      ;
      lVar5 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      ::std::__cxx11::string::~string((string *)&local_d50);
      BaseScalarFunction::SetReturnsError
                (&local_230,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_230;
    }
  }
  else {
    switch(LVar1) {
    case INTEGER:
      if (right_type->id_ != DATE) goto switchD_014b1346_caseD_e;
      ::std::__cxx11::string::string((string *)&local_e88,"+",(allocator *)&local_1698);
      LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
      LogicalType::LogicalType(&local_16b8,right_type);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&stack0xffffffffffffe930;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_1260,__l_00,(allocator_type *)&local_1678);
      LogicalType::LogicalType(&local_1278,right_type);
      local_14f8[1] = (code *)0x0;
      local_14f8[0] =
           ScalarFunction::BinaryFunction<int,duckdb::date_t,duckdb::date_t,duckdb::AddOperator>;
      local_14e0 = ::std::
                   _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                   ::_M_invoke;
      local_14e8 = ::std::
                   _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                   ::_M_manager;
      LogicalType::LogicalType(&local_ea0,INVALID);
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_00._0_8_ = &local_ea0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_ffffffffffffe91c;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_ffffffffffffe924;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_e88,(vector<duckdb::LogicalType,_true> *)&local_1260,
                 &local_1278,(scalar_function_t *)local_14f8,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs_00,CONSISTENT,
                 (FunctionNullHandling)in_stack_ffffffffffffe930,
                 (bind_lambda_function_t)in_stack_ffffffffffffe938);
      LogicalType::~LogicalType(&local_ea0);
      ::std::_Function_base::~_Function_base((_Function_base *)local_14f8);
      LogicalType::~LogicalType(&local_1278);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1260)
      ;
      lVar5 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      ::std::__cxx11::string::~string((string *)&local_e88);
      BaseScalarFunction::SetReturnsError
                (&local_5a0,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_5a0;
      break;
    case BIGINT:
    case TIMESTAMP_SEC:
    case TIMESTAMP_MS:
switchD_014b1346_caseD_e:
      pNVar4 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffe930,"AddFunction for types %s, %s",
                 (allocator *)&local_1698);
      EnumUtil::ToString<duckdb::LogicalTypeId>(&local_ca0,left_type->id_);
      EnumUtil::ToString<duckdb::LogicalTypeId>(&local_cc0,right_type->id_);
      NotImplementedException::NotImplementedException<std::__cxx11::string,std::__cxx11::string>
                (pNVar4,(string *)&stack0xffffffffffffe930,&local_ca0,&local_cc0);
      __cxa_throw(pNVar4,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case DATE:
      LVar1 = right_type->id_;
      if (LVar1 == TIME_TZ) {
        ::std::__cxx11::string::string((string *)&local_e50,"+",(allocator *)&local_1698);
        LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
        LogicalType::LogicalType(&local_16b8,right_type);
        __l_11._M_len = 2;
        __l_11._M_array = (iterator)&stack0xffffffffffffe930;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_1230,__l_11,(allocator_type *)&local_1678);
        LogicalType::LogicalType(&local_1248,TIMESTAMP_TZ);
        local_14d8[1] = (code *)0x0;
        local_14d8[0] =
             ScalarFunction::
             BinaryFunction<duckdb::date_t,duckdb::dtime_tz_t,duckdb::timestamp_t,duckdb::AddOperator>
        ;
        local_14c0 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_invoke;
        local_14c8 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_manager;
        LogicalType::LogicalType(&local_e68,INVALID);
        varargs_10.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_10._0_8_ = &local_e68;
        varargs_10.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_ffffffffffffe91c;
        varargs_10.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_10.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_ffffffffffffe924;
        ScalarFunction::ScalarFunction
                  (__return_storage_ptr__,&local_e50,
                   (vector<duckdb::LogicalType,_true> *)&local_1230,&local_1248,
                   (scalar_function_t *)local_14d8,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs_10,CONSISTENT,
                   (FunctionNullHandling)in_stack_ffffffffffffe930,
                   (bind_lambda_function_t)in_stack_ffffffffffffe938);
        LogicalType::~LogicalType(&local_e68);
        ::std::_Function_base::~_Function_base((_Function_base *)local_14d8);
        LogicalType::~LogicalType(&local_1248);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_1230);
        lVar5 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        ::std::__cxx11::string::~string((string *)&local_e50);
        BaseScalarFunction::SetReturnsError
                  (&local_4f0,&__return_storage_ptr__->super_BaseScalarFunction);
        this = &local_4f0;
      }
      else if (LVar1 == TIME) {
        ::std::__cxx11::string::string((string *)&local_e18,"+",(allocator *)&local_1698);
        LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
        LogicalType::LogicalType(&local_16b8,right_type);
        __l_12._M_len = 2;
        __l_12._M_array = (iterator)&stack0xffffffffffffe930;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_1200,__l_12,(allocator_type *)&local_1678);
        LogicalType::LogicalType(&local_1218,TIMESTAMP);
        local_14b8[1] = (code *)0x0;
        local_14b8[0] =
             ScalarFunction::
             BinaryFunction<duckdb::date_t,duckdb::dtime_t,duckdb::timestamp_t,duckdb::AddOperator>;
        local_14a0 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_invoke;
        local_14a8 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_manager;
        LogicalType::LogicalType(&local_e30,INVALID);
        varargs_11.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_11._0_8_ = &local_e30;
        varargs_11.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_ffffffffffffe91c;
        varargs_11.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_11.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_ffffffffffffe924;
        ScalarFunction::ScalarFunction
                  (__return_storage_ptr__,&local_e18,
                   (vector<duckdb::LogicalType,_true> *)&local_1200,&local_1218,
                   (scalar_function_t *)local_14b8,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs_11,CONSISTENT,
                   (FunctionNullHandling)in_stack_ffffffffffffe930,
                   (bind_lambda_function_t)in_stack_ffffffffffffe938);
        LogicalType::~LogicalType(&local_e30);
        ::std::_Function_base::~_Function_base((_Function_base *)local_14b8);
        LogicalType::~LogicalType(&local_1218);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_1200);
        lVar5 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        ::std::__cxx11::string::~string((string *)&local_e18);
        BaseScalarFunction::SetReturnsError
                  (&local_440,&__return_storage_ptr__->super_BaseScalarFunction);
        this = &local_440;
      }
      else if (LVar1 == INTERVAL) {
        ::std::__cxx11::string::string((string *)&local_de0,"+",(allocator *)&local_1698);
        LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
        LogicalType::LogicalType(&local_16b8,right_type);
        __l_10._M_len = 2;
        __l_10._M_array = (iterator)&stack0xffffffffffffe930;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_11d0,__l_10,(allocator_type *)&local_1678);
        LogicalType::LogicalType(&local_11e8,TIMESTAMP);
        local_1498[1] = (code *)0x0;
        local_1498[0] =
             ScalarFunction::
             BinaryFunction<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::AddOperator>
        ;
        local_1480 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_invoke;
        local_1488 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_manager;
        LogicalType::LogicalType(&local_df8,INVALID);
        varargs_09.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_09._0_8_ = &local_df8;
        varargs_09.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_ffffffffffffe91c;
        varargs_09.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_09.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_ffffffffffffe924;
        ScalarFunction::ScalarFunction
                  (__return_storage_ptr__,&local_de0,
                   (vector<duckdb::LogicalType,_true> *)&local_11d0,&local_11e8,
                   (scalar_function_t *)local_1498,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs_09,CONSISTENT,
                   (FunctionNullHandling)in_stack_ffffffffffffe930,
                   (bind_lambda_function_t)in_stack_ffffffffffffe938);
        LogicalType::~LogicalType(&local_df8);
        ::std::_Function_base::~_Function_base((_Function_base *)local_1498);
        LogicalType::~LogicalType(&local_11e8);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_11d0);
        lVar5 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        ::std::__cxx11::string::~string((string *)&local_de0);
        BaseScalarFunction::SetReturnsError
                  (&local_390,&__return_storage_ptr__->super_BaseScalarFunction);
        this = &local_390;
      }
      else {
        if (LVar1 != INTEGER) goto switchD_014b1346_caseD_e;
        ::std::__cxx11::string::string((string *)&local_da8,"+",(allocator *)&local_1698);
        LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
        LogicalType::LogicalType(&local_16b8,right_type);
        __l_04._M_len = 2;
        __l_04._M_array = (iterator)&stack0xffffffffffffe930;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_11a0,__l_04,(allocator_type *)&local_1678);
        LogicalType::LogicalType(&local_11b8,DATE);
        local_1478[1] = (code *)0x0;
        local_1478[0] =
             ScalarFunction::BinaryFunction<duckdb::date_t,int,duckdb::date_t,duckdb::AddOperator>;
        local_1460 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_invoke;
        local_1468 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_manager;
        LogicalType::LogicalType(&local_dc0,INVALID);
        varargs_03.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_03._0_8_ = &local_dc0;
        varargs_03.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_ffffffffffffe91c;
        varargs_03.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_03.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_ffffffffffffe924;
        ScalarFunction::ScalarFunction
                  (__return_storage_ptr__,&local_da8,
                   (vector<duckdb::LogicalType,_true> *)&local_11a0,&local_11b8,
                   (scalar_function_t *)local_1478,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs_03,CONSISTENT,
                   (FunctionNullHandling)in_stack_ffffffffffffe930,
                   (bind_lambda_function_t)in_stack_ffffffffffffe938);
        LogicalType::~LogicalType(&local_dc0);
        ::std::_Function_base::~_Function_base((_Function_base *)local_1478);
        LogicalType::~LogicalType(&local_11b8);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_11a0);
        lVar5 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        ::std::__cxx11::string::~string((string *)&local_da8);
        BaseScalarFunction::SetReturnsError
                  (&local_2e0,&__return_storage_ptr__->super_BaseScalarFunction);
        this = &local_2e0;
      }
      break;
    case TIME:
      if (right_type->id_ == DATE) {
        ::std::__cxx11::string::string((string *)&local_1010,"+",(allocator *)&local_1698);
        LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
        LogicalType::LogicalType(&local_16b8,right_type);
        __l_08._M_len = 2;
        __l_08._M_array = (iterator)&stack0xffffffffffffe930;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_13b0,__l_08,(allocator_type *)&local_1678);
        LogicalType::LogicalType(&local_13c8,TIMESTAMP);
        local_15d8[1] = (code *)0x0;
        local_15d8[0] =
             ScalarFunction::
             BinaryFunction<duckdb::dtime_t,duckdb::date_t,duckdb::timestamp_t,duckdb::AddOperator>;
        local_15c0 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_invoke;
        local_15c8 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_manager;
        LogicalType::LogicalType(&local_1028,INVALID);
        varargs_07.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_07._0_8_ = &local_1028;
        varargs_07.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_ffffffffffffe91c;
        varargs_07.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_07.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_ffffffffffffe924;
        ScalarFunction::ScalarFunction
                  (__return_storage_ptr__,&local_1010,
                   (vector<duckdb::LogicalType,_true> *)&local_13b0,&local_13c8,
                   (scalar_function_t *)local_15d8,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs_07,CONSISTENT,
                   (FunctionNullHandling)in_stack_ffffffffffffe930,
                   (bind_lambda_function_t)in_stack_ffffffffffffe938);
        LogicalType::~LogicalType(&local_1028);
        ::std::_Function_base::~_Function_base((_Function_base *)local_15d8);
        LogicalType::~LogicalType(&local_13c8);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_13b0);
        lVar5 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        ::std::__cxx11::string::~string((string *)&local_1010);
        BaseScalarFunction::SetReturnsError
                  (&local_a70,&__return_storage_ptr__->super_BaseScalarFunction);
        this = &local_a70;
      }
      else {
        if (right_type->id_ != INTERVAL) goto switchD_014b1346_caseD_e;
        ::std::__cxx11::string::string((string *)&local_fd8,"+",(allocator *)&local_1698);
        LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
        LogicalType::LogicalType(&local_16b8,right_type);
        __l_05._M_len = 2;
        __l_05._M_array = (iterator)&stack0xffffffffffffe930;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_1380,__l_05,(allocator_type *)&local_1678);
        LogicalType::LogicalType(&local_1398,TIME);
        local_15b8[1] = (code *)0x0;
        local_15b8[0] =
             ScalarFunction::
             BinaryFunction<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t,duckdb::AddTimeOperator>
        ;
        local_15a0 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_invoke;
        local_15a8 = ::std::
                     _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     ::_M_manager;
        LogicalType::LogicalType(&local_ff0,INVALID);
        varargs_04.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_04._0_8_ = &local_ff0;
        varargs_04.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_ffffffffffffe91c;
        varargs_04.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_04.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_ffffffffffffe924;
        ScalarFunction::ScalarFunction
                  (__return_storage_ptr__,&local_fd8,
                   (vector<duckdb::LogicalType,_true> *)&local_1380,&local_1398,
                   (scalar_function_t *)local_15b8,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs_04,CONSISTENT,
                   (FunctionNullHandling)in_stack_ffffffffffffe930,
                   (bind_lambda_function_t)in_stack_ffffffffffffe938);
        LogicalType::~LogicalType(&local_ff0);
        ::std::_Function_base::~_Function_base((_Function_base *)local_15b8);
        LogicalType::~LogicalType(&local_1398);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_1380);
        lVar5 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        ::std::__cxx11::string::~string((string *)&local_fd8);
        BaseScalarFunction::SetReturnsError
                  (&local_9c0,&__return_storage_ptr__->super_BaseScalarFunction);
        this = &local_9c0;
      }
      break;
    case TIMESTAMP:
      if (right_type->id_ != INTERVAL) goto switchD_014b1346_caseD_e;
      ::std::__cxx11::string::string((string *)&local_10b8,"+",(allocator *)&local_1698);
      LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
      LogicalType::LogicalType(&local_16b8,right_type);
      __l_06._M_len = 2;
      __l_06._M_array = (iterator)&stack0xffffffffffffe930;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_1440,__l_06,(allocator_type *)&local_1678);
      LogicalType::LogicalType(&local_1458,TIMESTAMP);
      local_1638[1] = (code *)0x0;
      local_1638[0] =
           ScalarFunction::
           BinaryFunction<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::AddOperator>
      ;
      local_1620 = ::std::
                   _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                   ::_M_invoke;
      local_1628 = ::std::
                   _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                   ::_M_manager;
      LogicalType::LogicalType(&local_10d0,INVALID);
      varargs_05.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_05._0_8_ = &local_10d0;
      varargs_05.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_ffffffffffffe91c;
      varargs_05.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_05.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_ffffffffffffe924;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_10b8,(vector<duckdb::LogicalType,_true> *)&local_1440
                 ,&local_1458,(scalar_function_t *)local_1638,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs_05,CONSISTENT,
                 (FunctionNullHandling)in_stack_ffffffffffffe930,
                 (bind_lambda_function_t)in_stack_ffffffffffffe938);
      LogicalType::~LogicalType(&local_10d0);
      ::std::_Function_base::~_Function_base((_Function_base *)local_1638);
      LogicalType::~LogicalType(&local_1458);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1440)
      ;
      lVar5 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      ::std::__cxx11::string::~string((string *)&local_10b8);
      BaseScalarFunction::SetReturnsError
                (&local_c80,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_c80;
      break;
    default:
      if (LVar1 == INTERVAL) {
        LVar1 = right_type->id_;
        if (LVar1 == DATE) {
          ::std::__cxx11::string::string((string *)&local_ef8,"+",(allocator *)&local_1698);
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
          LogicalType::LogicalType(&local_16b8,right_type);
          __l_14._M_len = 2;
          __l_14._M_array = (iterator)&stack0xffffffffffffe930;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_12c0,__l_14,(allocator_type *)&local_1678);
          LogicalType::LogicalType(&local_12d8,TIMESTAMP);
          local_1538[1] = (code *)0x0;
          local_1538[0] =
               ScalarFunction::
               BinaryFunction<duckdb::interval_t,duckdb::date_t,duckdb::timestamp_t,duckdb::AddOperator>
          ;
          local_1520 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_invoke;
          local_1528 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_manager;
          LogicalType::LogicalType(&local_f10,INVALID);
          varargs_13.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_13._0_8_ = &local_f10;
          varargs_13.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe91c;
          varargs_13.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_13.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe924;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_ef8,
                     (vector<duckdb::LogicalType,_true> *)&local_12c0,&local_12d8,
                     (scalar_function_t *)local_1538,(bind_scalar_function_t)0x0,
                     (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                     (init_local_state_t)0x0,varargs_13,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe930,
                     (bind_lambda_function_t)in_stack_ffffffffffffe938);
          LogicalType::~LogicalType(&local_f10);
          ::std::_Function_base::~_Function_base((_Function_base *)local_1538);
          LogicalType::~LogicalType(&local_12d8);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_12c0);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          ::std::__cxx11::string::~string((string *)&local_ef8);
          BaseScalarFunction::SetReturnsError
                    (&local_700,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_700;
        }
        else if (LVar1 == TIME) {
          ::std::__cxx11::string::string((string *)&local_f30,"+",(allocator *)&local_1698);
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
          LogicalType::LogicalType(&local_16b8,right_type);
          __l_13._M_len = 2;
          __l_13._M_array = (iterator)&stack0xffffffffffffe930;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_12f0,__l_13,(allocator_type *)&local_1678);
          LogicalType::LogicalType(&local_1308,TIME);
          local_1558[1] = (code *)0x0;
          local_1558[0] =
               ScalarFunction::
               BinaryFunction<duckdb::interval_t,duckdb::dtime_t,duckdb::dtime_t,duckdb::AddTimeOperator>
          ;
          local_1540 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_invoke;
          local_1548 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_manager;
          LogicalType::LogicalType(&local_f48,INVALID);
          varargs_12.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_12._0_8_ = &local_f48;
          varargs_12.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe91c;
          varargs_12.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_12.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe924;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_f30,
                     (vector<duckdb::LogicalType,_true> *)&local_12f0,&local_1308,
                     (scalar_function_t *)local_1558,(bind_scalar_function_t)0x0,
                     (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                     (init_local_state_t)0x0,varargs_12,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe930,
                     (bind_lambda_function_t)in_stack_ffffffffffffe938);
          LogicalType::~LogicalType(&local_f48);
          ::std::_Function_base::~_Function_base((_Function_base *)local_1558);
          LogicalType::~LogicalType(&local_1308);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_12f0);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          ::std::__cxx11::string::~string((string *)&local_f30);
          BaseScalarFunction::SetReturnsError
                    (&local_7b0,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_7b0;
        }
        else if (LVar1 == TIMESTAMP) {
          ::std::__cxx11::string::string((string *)&local_fa0,"+",(allocator *)&local_1698);
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
          LogicalType::LogicalType(&local_16b8,right_type);
          __l_15._M_len = 2;
          __l_15._M_array = (iterator)&stack0xffffffffffffe930;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_1350,__l_15,(allocator_type *)&local_1678);
          LogicalType::LogicalType(&local_1368,TIMESTAMP);
          local_1598[1] = (code *)0x0;
          local_1598[0] =
               ScalarFunction::
               BinaryFunction<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::AddOperator>
          ;
          local_1580 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_invoke;
          local_1588 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_manager;
          LogicalType::LogicalType(&local_fb8,INVALID);
          varargs_14.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_14._0_8_ = &local_fb8;
          varargs_14.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe91c;
          varargs_14.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_14.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe924;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_fa0,
                     (vector<duckdb::LogicalType,_true> *)&local_1350,&local_1368,
                     (scalar_function_t *)local_1598,(bind_scalar_function_t)0x0,
                     (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                     (init_local_state_t)0x0,varargs_14,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe930,
                     (bind_lambda_function_t)in_stack_ffffffffffffe938);
          LogicalType::~LogicalType(&local_fb8);
          ::std::_Function_base::~_Function_base((_Function_base *)local_1598);
          LogicalType::~LogicalType(&local_1368);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_1350);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          ::std::__cxx11::string::~string((string *)&local_fa0);
          BaseScalarFunction::SetReturnsError
                    (&local_910,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_910;
        }
        else if (LVar1 == TIME_TZ) {
          ::std::__cxx11::string::string((string *)&local_f68,"+",(allocator *)&local_1698);
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
          LogicalType::LogicalType(&local_16b8,right_type);
          __l_16._M_len = 2;
          __l_16._M_array = (iterator)&stack0xffffffffffffe930;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_1320,__l_16,(allocator_type *)&local_1678);
          LogicalType::LogicalType(&local_1338,TIME_TZ);
          local_1578[1] = (code *)0x0;
          local_1578[0] =
               ScalarFunction::
               BinaryFunction<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::AddTimeOperator>
          ;
          local_1560 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_invoke;
          local_1568 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_manager;
          LogicalType::LogicalType(&local_f80,INVALID);
          varargs_15.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_15._0_8_ = &local_f80;
          varargs_15.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe91c;
          varargs_15.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_15.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe924;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_f68,
                     (vector<duckdb::LogicalType,_true> *)&local_1320,&local_1338,
                     (scalar_function_t *)local_1578,(bind_scalar_function_t)0x0,
                     (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                     (init_local_state_t)0x0,varargs_15,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe930,
                     (bind_lambda_function_t)in_stack_ffffffffffffe938);
          LogicalType::~LogicalType(&local_f80);
          ::std::_Function_base::~_Function_base((_Function_base *)local_1578);
          LogicalType::~LogicalType(&local_1338);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_1320);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          ::std::__cxx11::string::~string((string *)&local_f68);
          BaseScalarFunction::SetReturnsError
                    (&local_860,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_860;
        }
        else {
          if (LVar1 != INTERVAL) goto switchD_014b1346_caseD_e;
          ::std::__cxx11::string::string((string *)&local_ec0,"+",(allocator *)&local_1698);
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
          LogicalType::LogicalType(&local_16b8,right_type);
          __l_07._M_len = 2;
          __l_07._M_array = (iterator)&stack0xffffffffffffe930;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_1290,__l_07,(allocator_type *)&local_1678);
          LogicalType::LogicalType(&local_12a8,INTERVAL);
          local_1518[1] = (code *)0x0;
          local_1518[0] =
               ScalarFunction::
               BinaryFunction<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::AddOperator>
          ;
          local_1500 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_invoke;
          local_1508 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_manager;
          LogicalType::LogicalType(&local_ed8,INVALID);
          varargs_06.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_06._0_8_ = &local_ed8;
          varargs_06.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe91c;
          varargs_06.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_06.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe924;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_ec0,
                     (vector<duckdb::LogicalType,_true> *)&local_1290,&local_12a8,
                     (scalar_function_t *)local_1518,(bind_scalar_function_t)0x0,
                     (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                     (init_local_state_t)0x0,varargs_06,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe930,
                     (bind_lambda_function_t)in_stack_ffffffffffffe938);
          LogicalType::~LogicalType(&local_ed8);
          ::std::_Function_base::~_Function_base((_Function_base *)local_1518);
          LogicalType::~LogicalType(&local_12a8);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_1290);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          ::std::__cxx11::string::~string((string *)&local_ec0);
          BaseScalarFunction::SetReturnsError
                    (&local_650,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_650;
        }
      }
      else {
        if (LVar1 != TIME_TZ) goto switchD_014b1346_caseD_e;
        if (right_type->id_ == INTERVAL) {
          ::std::__cxx11::string::string((string *)&local_1080,"+",(allocator *)&local_1698);
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
          LogicalType::LogicalType(&local_16b8,right_type);
          __l_09._M_len = 2;
          __l_09._M_array = (iterator)&stack0xffffffffffffe930;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_1410,__l_09,(allocator_type *)&local_1678);
          LogicalType::LogicalType(&local_1428,TIME_TZ);
          local_1618[1] = (code *)0x0;
          local_1618[0] =
               ScalarFunction::
               BinaryFunction<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::AddTimeOperator>
          ;
          local_1600 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_invoke;
          local_1608 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_manager;
          LogicalType::LogicalType(&local_1098,INVALID);
          varargs_08.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_08._0_8_ = &local_1098;
          varargs_08.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe91c;
          varargs_08.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_08.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe924;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_1080,
                     (vector<duckdb::LogicalType,_true> *)&local_1410,&local_1428,
                     (scalar_function_t *)local_1618,(bind_scalar_function_t)0x0,
                     (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                     (init_local_state_t)0x0,varargs_08,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe930,
                     (bind_lambda_function_t)in_stack_ffffffffffffe938);
          LogicalType::~LogicalType(&local_1098);
          ::std::_Function_base::~_Function_base((_Function_base *)local_1618);
          LogicalType::~LogicalType(&local_1428);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_1410);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          ::std::__cxx11::string::~string((string *)&local_1080);
          BaseScalarFunction::SetReturnsError
                    (&local_bd0,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_bd0;
        }
        else {
          if (right_type->id_ != DATE) goto switchD_014b1346_caseD_e;
          ::std::__cxx11::string::string((string *)&local_1048,"+",(allocator *)&local_1698);
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe930,left_type);
          LogicalType::LogicalType(&local_16b8,right_type);
          __l_02._M_len = 2;
          __l_02._M_array = (iterator)&stack0xffffffffffffe930;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_13e0,__l_02,(allocator_type *)&local_1678);
          LogicalType::LogicalType(&local_13f8,TIMESTAMP_TZ);
          local_15f8[1] = (code *)0x0;
          local_15f8[0] =
               ScalarFunction::
               BinaryFunction<duckdb::dtime_tz_t,duckdb::date_t,duckdb::timestamp_t,duckdb::AddOperator>
          ;
          local_15e0 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_invoke;
          local_15e8 = ::std::
                       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       ::_M_manager;
          LogicalType::LogicalType(&local_1060,INVALID);
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_01._0_8_ = &local_1060;
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe91c;
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe924;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_1048,
                     (vector<duckdb::LogicalType,_true> *)&local_13e0,&local_13f8,
                     (scalar_function_t *)local_15f8,(bind_scalar_function_t)0x0,
                     (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                     (init_local_state_t)0x0,varargs_01,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe930,
                     (bind_lambda_function_t)in_stack_ffffffffffffe938);
          LogicalType::~LogicalType(&local_1060);
          ::std::_Function_base::~_Function_base((_Function_base *)local_15f8);
          LogicalType::~LogicalType(&local_13f8);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_13e0);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe930 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          ::std::__cxx11::string::~string((string *)&local_1048);
          BaseScalarFunction::SetReturnsError
                    (&local_b20,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_b20;
        }
      }
    }
  }
  BaseScalarFunction::~BaseScalarFunction(this);
  return __return_storage_ptr__;
}

Assistant:

ScalarFunction AddFunction::GetFunction(const LogicalType &left_type, const LogicalType &right_type) {
	if (left_type.IsNumeric() && left_type.id() == right_type.id()) {
		if (left_type.id() == LogicalTypeId::DECIMAL) {
			auto function = ScalarFunction("+", {left_type, right_type}, left_type, nullptr,
			                               BindDecimalAddSubtract<AddOperator, DecimalAddOverflowCheck>);
			BaseScalarFunction::SetReturnsError(function);
			function.serialize = SerializeDecimalArithmetic;
			function.deserialize = DeserializeDecimalArithmetic<AddOperator, DecimalAddOverflowCheck>;
			return function;
		} else if (left_type.IsIntegral()) {
			ScalarFunction function("+", {left_type, right_type}, left_type,
			                        GetScalarIntegerFunction<AddOperatorOverflowCheck>(left_type.InternalType()),
			                        nullptr, nullptr,
			                        PropagateNumericStats<TryAddOperator, AddPropagateStatistics, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else {
			ScalarFunction function("+", {left_type, right_type}, left_type,
			                        GetScalarBinaryFunction<AddOperator>(left_type.InternalType()));
			BaseScalarFunction::SetReturnsError(function);
			return function;
		}
	}

	switch (left_type.id()) {
	case LogicalTypeId::DATE:
		if (right_type.id() == LogicalTypeId::INTEGER) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::DATE,
			                        ScalarFunction::BinaryFunction<date_t, int32_t, date_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<date_t, interval_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<date_t, dtime_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME_TZ) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP_TZ,
			                        ScalarFunction::BinaryFunction<date_t, dtime_tz_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::INTEGER:
		if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, right_type,
			                        ScalarFunction::BinaryFunction<int32_t, date_t, date_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::INTERVAL:
		if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::INTERVAL,
			                        ScalarFunction::BinaryFunction<interval_t, interval_t, interval_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<interval_t, date_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIME,
			                        ScalarFunction::BinaryFunction<interval_t, dtime_t, dtime_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME_TZ) {
			ScalarFunction function(
			    "+", {left_type, right_type}, LogicalType::TIME_TZ,
			    ScalarFunction::BinaryFunction<interval_t, dtime_tz_t, dtime_tz_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIMESTAMP) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<interval_t, timestamp_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::TIME:
		if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIME,
			                        ScalarFunction::BinaryFunction<dtime_t, interval_t, dtime_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<dtime_t, date_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::TIME_TZ:
		if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP_TZ,
			                        ScalarFunction::BinaryFunction<dtime_tz_t, date_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function(
			    "+", {left_type, right_type}, LogicalType::TIME_TZ,
			    ScalarFunction::BinaryFunction<dtime_tz_t, interval_t, dtime_tz_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::TIMESTAMP:
		if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<timestamp_t, interval_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	default:
		break;
	}
	// LCOV_EXCL_START
	throw NotImplementedException("AddFunction for types %s, %s", EnumUtil::ToString(left_type.id()),
	                              EnumUtil::ToString(right_type.id()));
	// LCOV_EXCL_STOP
}